

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep_context.cc
# Opt level: O2

void __thiscall
p2t::SweepContext::AddHole
          (SweepContext *this,vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *polyline)

{
  pointer ppPVar1;
  uint uVar2;
  
  InitEdges(this,polyline);
  uVar2 = 0;
  while( true ) {
    ppPVar1 = (polyline->super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(polyline->super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3) <=
        (ulong)uVar2) break;
    std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>::push_back
              (&this->points_,ppPVar1 + uVar2);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void SweepContext::AddHole(const std::vector<Point*>& polyline)
{
  InitEdges(polyline);
  for(unsigned int i = 0; i < polyline.size(); i++) {
    points_.push_back(polyline[i]);
  }
}